

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_prefix_coding.cpp
# Opt level: O1

bool crnlib::prefix_coding::generate_decoder_tables
               (uint num_syms,uint8 *pCodesizes,decoder_tables *pTables,uint table_bits)

{
  int iVar1;
  ushort uVar2;
  uint uVar3;
  uint16 *puVar4;
  uint32 *puVar5;
  uint uVar6;
  bool bVar7;
  uint i;
  uint uVar8;
  void *pvVar9;
  uint *puVar10;
  byte bVar11;
  byte bVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  uint uVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  uint num_codes [17];
  uint min_codes [16];
  uint sorted_positions [17];
  int local_108 [19];
  uint auStack_bc [17];
  uint auStack_78 [18];
  
  bVar7 = table_bits < 0xc && num_syms != 0;
  if (table_bits >= 0xc || num_syms == 0) {
    return bVar7;
  }
  pTables->m_num_syms = num_syms;
  local_108[0xc] = 0;
  local_108[0xd] = 0;
  local_108[0xe] = 0;
  local_108[0xf] = 0;
  local_108[8] = 0;
  local_108[9] = 0;
  local_108[10] = 0;
  local_108[0xb] = 0;
  local_108[4] = 0;
  local_108[5] = 0;
  local_108[6] = 0;
  local_108[7] = 0;
  local_108[0] = 0;
  local_108[1] = 0;
  local_108[2] = 0;
  local_108[3] = 0;
  local_108[0x10] = 0;
  uVar13 = 0;
  do {
    if ((ulong)pCodesizes[uVar13] != 0) {
      local_108[pCodesizes[uVar13]] = local_108[pCodesizes[uVar13]] + 1;
    }
    uVar13 = uVar13 + 1;
  } while (num_syms != uVar13);
  uVar8 = 0xffffffff;
  lVar14 = 0;
  bVar11 = 0xf;
  uVar16 = 0;
  uVar18 = 0;
  uVar21 = 0;
  do {
    iVar20 = local_108[lVar14 + 1];
    if (iVar20 == 0) {
      pTables->m_max_codes[lVar14] = 0;
    }
    else {
      uVar19 = (int)lVar14 + 1;
      if (uVar19 <= uVar8) {
        uVar8 = uVar19;
      }
      if (uVar21 <= uVar19) {
        uVar21 = uVar19;
      }
      iVar1 = iVar20 + uVar16;
      auStack_bc[lVar14 + 1] = uVar16;
      uVar16 = uVar16 + iVar20;
      pTables->m_max_codes[lVar14] = (~(-1 << (bVar11 & 0x1f)) | iVar1 + -1 << (bVar11 & 0x1f)) + 1;
      pTables->m_val_ptrs[lVar14] = uVar18;
      auStack_78[lVar14 + 1] = uVar18;
      uVar18 = iVar20 + uVar18;
    }
    uVar16 = uVar16 * 2;
    bVar11 = bVar11 - 1;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x10);
  pTables->m_total_used_syms = uVar18;
  if (pTables->m_cur_sorted_symbol_order_size < uVar18) {
    uVar16 = uVar18 - 1;
    if (((uVar18 & uVar16) != 0) &&
       (uVar16 = uVar16 >> 0x10 | uVar16, uVar16 = uVar16 >> 8 | uVar16,
       uVar16 = uVar16 >> 4 | uVar16, uVar16 = uVar16 >> 2 | uVar16,
       uVar18 = (uVar16 >> 1 | uVar16) + 1, num_syms < uVar18)) {
      uVar18 = num_syms;
    }
    pTables->m_cur_sorted_symbol_order_size = uVar18;
    puVar4 = pTables->m_sorted_symbol_order;
    if (puVar4 != (uint16 *)0x0) {
      if ((*(uint *)(puVar4 + -4) ^ *(uint *)(puVar4 + -2)) == 0xffffffff) {
        crnlib_free(puVar4 + -8);
      }
      pTables->m_sorted_symbol_order = (uint16 *)0x0;
    }
    uVar16 = pTables->m_cur_sorted_symbol_order_size +
             (uint)(pTables->m_cur_sorted_symbol_order_size == 0);
    pvVar9 = crnlib_malloc((ulong)uVar16 * 2 + 0x10);
    *(uint *)((long)pvVar9 + 0xc) = uVar16;
    *(uint *)((long)pvVar9 + 8) = ~uVar16;
    pTables->m_sorted_symbol_order = (uint16 *)((long)pvVar9 + 0x10);
  }
  pTables->m_min_code_size = (uint8)uVar8;
  pTables->m_max_code_size = (uint8)uVar21;
  uVar13 = 0;
  do {
    uVar17 = (ulong)pCodesizes[uVar13];
    if (uVar17 != 0) {
      uVar16 = auStack_78[uVar17];
      auStack_78[uVar17] = uVar16 + 1;
      pTables->m_sorted_symbol_order[uVar16] = (uint16)uVar13;
    }
    uVar13 = uVar13 + 1;
  } while (num_syms + (num_syms == 0) != uVar13);
  uVar13 = 0;
  uVar16 = (uint)pTables->m_min_code_size;
  if (uVar16 < table_bits) {
    uVar13 = (ulong)table_bits;
  }
  uVar8 = (uint)uVar13;
  pTables->m_table_bits = uVar8;
  if (uVar16 < table_bits) {
    bVar11 = (byte)uVar13;
    uVar18 = 1 << (bVar11 & 0x1f);
    if (pTables->m_cur_lookup_size < uVar18) {
      pTables->m_cur_lookup_size = uVar18;
      puVar5 = pTables->m_lookup;
      if (puVar5 != (uint32 *)0x0) {
        if ((puVar5[-2] ^ puVar5[-1]) == 0xffffffff) {
          crnlib_free(puVar5 + -4);
        }
        pTables->m_lookup = (uint32 *)0x0;
      }
      pvVar9 = crnlib_malloc((ulong)((4 << (bVar11 & 0x1f)) + 0x10));
      *(uint *)((long)pvVar9 + 0xc) = uVar18;
      *(uint *)((long)pvVar9 + 8) = ~uVar18;
      pTables->m_lookup = (uint32 *)((long)pvVar9 + 0x10);
    }
    memset(pTables->m_lookup,0xff,4L << (bVar11 & 0x3f));
    if (uVar16 < table_bits) {
      uVar17 = 1;
      do {
        if (local_108[uVar17] != 0) {
          uVar3 = pTables->m_max_codes[uVar17 - 1];
          uVar19 = uVar3 - 1 >> (0x10U - (char)uVar17 & 0x1f);
          uVar18 = auStack_bc[uVar17];
          if ((uVar3 == 0) || (uVar18 <= uVar19)) {
            bVar12 = bVar11 - (char)uVar17;
            iVar20 = pTables->m_max_codes[uVar17 + 0x10] - uVar18;
            do {
              uVar2 = pTables->m_sorted_symbol_order[iVar20 + uVar18];
              uVar15 = 1;
              do {
                pTables->m_lookup[((uVar18 << (bVar12 & 0x1f)) + uVar15) - 1] =
                     (uint)uVar2 | (int)uVar17 << 0x10;
                uVar6 = uVar15 >> (bVar12 & 0x1f);
                uVar15 = uVar15 + 1;
              } while (uVar6 == 0);
              uVar18 = uVar18 + 1;
            } while ((uVar3 == 0) || (uVar18 <= uVar19));
          }
        }
        uVar17 = uVar17 + 1;
      } while (uVar17 != uVar8 + 1 + (uint)(uVar8 == 0));
    }
  }
  lVar14 = 0;
  do {
    pTables->m_val_ptrs[lVar14] = pTables->m_val_ptrs[lVar14] - auStack_bc[lVar14 + 1];
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0x10);
  pTables->m_table_max_code = 0;
  pTables->m_decode_start_code_size = (uint)pTables->m_min_code_size;
  if (uVar16 < table_bits) {
    puVar10 = pTables->m_max_codes + (uVar8 - 1);
    do {
      if (local_108[uVar13] != 0) {
        pTables->m_table_max_code = *puVar10;
        uVar16 = uVar8 + 1;
        pTables->m_decode_start_code_size = uVar16;
        if (uVar8 < uVar21) goto LAB_0019a92f;
        break;
      }
      puVar10 = puVar10 + -1;
      uVar16 = (int)uVar13 - 1;
      uVar13 = (ulong)uVar16;
    } while (uVar16 != 0);
  }
  goto LAB_0019a944;
  while (uVar16 = uVar16 + 1, uVar16 <= uVar21) {
LAB_0019a92f:
    if (local_108[uVar16] != 0) {
      pTables->m_decode_start_code_size = uVar16;
      break;
    }
  }
LAB_0019a944:
  pTables->m_max_codes[0x10] = 0xffffffff;
  pTables->m_val_ptrs[0x10] = 0xfffff;
  pTables->m_table_shift = 0x20 - pTables->m_table_bits;
  return bVar7;
}

Assistant:

bool generate_decoder_tables(uint num_syms, const uint8* pCodesizes, decoder_tables* pTables, uint table_bits) {
  uint min_codes[cMaxExpectedCodeSize];

  if ((!num_syms) || (table_bits > cMaxTableBits))
    return false;

  pTables->m_num_syms = num_syms;

  uint num_codes[cMaxExpectedCodeSize + 1];
  utils::zero_object(num_codes);

  for (uint i = 0; i < num_syms; i++) {
    uint c = pCodesizes[i];
    if (c)
      num_codes[c]++;
  }

  uint sorted_positions[cMaxExpectedCodeSize + 1];

  uint code = 0;

  uint total_used_syms = 0;
  uint max_code_size = 0;
  uint min_code_size = UINT_MAX;
  for (uint i = 1; i <= cMaxExpectedCodeSize; i++) {
    const uint n = num_codes[i];

    if (!n)
      pTables->m_max_codes[i - 1] = 0;  //UINT_MAX;
    else {
      min_code_size = math::minimum(min_code_size, i);
      max_code_size = math::maximum(max_code_size, i);

      min_codes[i - 1] = code;

      pTables->m_max_codes[i - 1] = code + n - 1;
      pTables->m_max_codes[i - 1] = 1 + ((pTables->m_max_codes[i - 1] << (16 - i)) | ((1 << (16 - i)) - 1));

      pTables->m_val_ptrs[i - 1] = total_used_syms;

      sorted_positions[i] = total_used_syms;

      code += n;
      total_used_syms += n;
    }

    code <<= 1;
  }

  pTables->m_total_used_syms = total_used_syms;

  if (total_used_syms > pTables->m_cur_sorted_symbol_order_size) {
    pTables->m_cur_sorted_symbol_order_size = total_used_syms;

    if (!math::is_power_of_2(total_used_syms))
      pTables->m_cur_sorted_symbol_order_size = math::minimum<uint>(num_syms, math::next_pow2(total_used_syms));

    if (pTables->m_sorted_symbol_order) {
      crnlib_delete_array(pTables->m_sorted_symbol_order);
      pTables->m_sorted_symbol_order = NULL;
    }

    pTables->m_sorted_symbol_order = crnlib_new_array<uint16>(pTables->m_cur_sorted_symbol_order_size);
  }

  pTables->m_min_code_size = static_cast<uint8>(min_code_size);
  pTables->m_max_code_size = static_cast<uint8>(max_code_size);

  for (uint i = 0; i < num_syms; i++) {
    uint c = pCodesizes[i];
    if (c) {
      CRNLIB_ASSERT(num_codes[c]);

      uint sorted_pos = sorted_positions[c]++;

      CRNLIB_ASSERT(sorted_pos < total_used_syms);

      pTables->m_sorted_symbol_order[sorted_pos] = static_cast<uint16>(i);
    }
  }

  if (table_bits <= pTables->m_min_code_size)
    table_bits = 0;
  pTables->m_table_bits = table_bits;

  if (table_bits) {
    uint table_size = 1 << table_bits;
    if (table_size > pTables->m_cur_lookup_size) {
      pTables->m_cur_lookup_size = table_size;

      if (pTables->m_lookup) {
        crnlib_delete_array(pTables->m_lookup);
        pTables->m_lookup = NULL;
      }

      pTables->m_lookup = crnlib_new_array<uint32>(table_size);
    }

    memset(pTables->m_lookup, 0xFF, static_cast<uint>(sizeof(pTables->m_lookup[0])) * (1UL << table_bits));

    for (uint codesize = 1; codesize <= table_bits; codesize++) {
      if (!num_codes[codesize])
        continue;

      const uint fillsize = table_bits - codesize;
      const uint fillnum = 1 << fillsize;

      const uint min_code = min_codes[codesize - 1];
      const uint max_code = pTables->get_unshifted_max_code(codesize);
      const uint val_ptr = pTables->m_val_ptrs[codesize - 1];

      for (uint code = min_code; code <= max_code; code++) {
        const uint sym_index = pTables->m_sorted_symbol_order[val_ptr + code - min_code];
        CRNLIB_ASSERT(pCodesizes[sym_index] == codesize);

        for (uint j = 0; j < fillnum; j++) {
          const uint t = j + (code << fillsize);

          CRNLIB_ASSERT(t < (1U << table_bits));

          CRNLIB_ASSERT(pTables->m_lookup[t] == cUINT32_MAX);

          pTables->m_lookup[t] = sym_index | (codesize << 16U);
        }
      }
    }
  }

  for (uint i = 0; i < cMaxExpectedCodeSize; i++)
    pTables->m_val_ptrs[i] -= min_codes[i];

  pTables->m_table_max_code = 0;
  pTables->m_decode_start_code_size = pTables->m_min_code_size;

  if (table_bits) {
    uint i;
    for (i = table_bits; i >= 1; i--) {
      if (num_codes[i]) {
        pTables->m_table_max_code = pTables->m_max_codes[i - 1];
        break;
      }
    }
    if (i >= 1) {
      pTables->m_decode_start_code_size = table_bits + 1;
      for (uint i = table_bits + 1; i <= max_code_size; i++) {
        if (num_codes[i]) {
          pTables->m_decode_start_code_size = i;
          break;
        }
      }
    }
  }

  // sentinels
  pTables->m_max_codes[cMaxExpectedCodeSize] = UINT_MAX;
  pTables->m_val_ptrs[cMaxExpectedCodeSize] = 0xFFFFF;

  pTables->m_table_shift = 32 - pTables->m_table_bits;

  return true;
}